

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void __thiscall luna::Lexer::LexMultiLineComment(Lexer *this)

{
  String *pSVar1;
  int iVar2;
  LexException *this_00;
  anon_union_16_2_eed97686_for_String_2 *module;
  
  do {
    while (iVar2 = this->current_, 0xc < iVar2) {
      if (iVar2 == 0xd) goto LAB_0014c414;
      if (iVar2 != 0x5d) goto LAB_0014c423;
      iVar2 = Next(this);
      this->current_ = iVar2;
      if (iVar2 == 0x5d) {
        iVar2 = Next(this);
        this->current_ = iVar2;
        return;
      }
    }
    if (iVar2 == 10) {
LAB_0014c414:
      LexNewLine(this);
    }
    else {
      if (iVar2 == -1) {
        this_00 = (LexException *)__cxa_allocate_exception(0x20);
        pSVar1 = this->module_;
        if ((pSVar1->super_GCObject).field_0x11 == '\0') {
          module = &pSVar1->field_1;
        }
        else {
          module = (anon_union_16_2_eed97686_for_String_2 *)(pSVar1->field_1).str_;
        }
        LexException::LexException<char_const(&)[49]>
                  (this_00,module->str_buffer_,this->line_,this->column_,
                   (char (*) [49])"expect complete multi-line comment before <eof>.");
        __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
      }
LAB_0014c423:
      iVar2 = Next(this);
      this->current_ = iVar2;
    }
  } while( true );
}

Assistant:

void Lexer::LexMultiLineComment()
    {
        bool is_comment_end = false;
        while (!is_comment_end)
        {
            if (current_ == ']')
            {
                current_ = Next();
                if (current_ == ']')
                {
                    is_comment_end = true;
                    current_ = Next();
                }
            }
            else if (current_ == EOF)
            {
                // uncompleted multi-line comment
                throw LexException(module_->GetCStr(), line_, column_,
                        "expect complete multi-line comment before <eof>.");
            }
            else if (current_ == '\r' || current_ == '\n')
            {
                LexNewLine();
            }
            else
            {
                current_ = Next();
            }
        }
    }